

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O1

void __thiscall
MADPComponentDiscreteStates::MADPComponentDiscreteStates
          (MADPComponentDiscreteStates *this,MADPComponentDiscreteStates *a)

{
  StateDistributionVector *pSVar1;
  StateDistributionVector *pSVar2;
  
  this->_vptr_MADPComponentDiscreteStates = (_func_int **)&PTR__MADPComponentDiscreteStates_005da218
  ;
  (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_initialized = a->_m_initialized;
  this->_m_nrStates = a->_m_nrStates;
  std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::operator=
            (&this->_m_stateVec,&a->_m_stateVec);
  pSVar2 = (StateDistributionVector *)operator_new(0x20);
  pSVar1 = a->_m_initialStateDistribution;
  (pSVar2->super_StateDistribution)._vptr_StateDistribution =
       (_func_int **)&PTR__StateDistribution_0059cc60;
  std::vector<double,_std::allocator<double>_>::vector(&pSVar2->super_SDV,&pSVar1->super_SDV);
  (pSVar2->super_StateDistribution)._vptr_StateDistribution =
       (_func_int **)&PTR__StateDistributionVector_0059cb98;
  this->_m_initialStateDistribution = pSVar2;
  return;
}

Assistant:

MADPComponentDiscreteStates::MADPComponentDiscreteStates(
    const MADPComponentDiscreteStates& a)
{
    _m_initialized=a._m_initialized;
    _m_nrStates=a._m_nrStates;
    _m_stateVec=a._m_stateVec;
    _m_initialStateDistribution=
        new StateDistributionVector(*a._m_initialStateDistribution);
}